

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C_matrix.h
# Opt level: O3

C_matrix<double> * __thiscall
C_matrix<double>::operator=
          (C_matrix<double> *__return_storage_ptr__,C_matrix<double> *this,C_matrix<double> *c)

{
  double *pdVar1;
  unsigned_short l;
  uint uVar2;
  int iVar3;
  unsigned_short c_00;
  uint uVar4;
  
  if (this != c) {
    iVar3 = c->m_L;
    if ((c->m_C != this->m_C) || (iVar3 != this->m_L)) {
      resize(this,iVar3,c->m_C);
      iVar3 = this->m_L;
    }
    if (0 < iVar3) {
      iVar3 = this->m_C;
      uVar2 = 0;
      l = 0;
      do {
        if (0 < iVar3) {
          uVar4 = 0;
          c_00 = 0;
          do {
            pdVar1 = operator()(c,l,c_00);
            iVar3 = this->m_C;
            this->m_A[(int)(iVar3 * uVar2 + uVar4)] = *pdVar1;
            c_00 = c_00 + 1;
            uVar4 = (uint)c_00;
          } while ((int)(uint)c_00 < iVar3);
        }
        l = l + 1;
        uVar2 = (uint)l;
      } while ((int)uVar2 < this->m_L);
    }
  }
  C_matrix(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

C_matrix<dataType> C_matrix<dataType>::operator= (C_matrix const& c)
{
    if(this==&c)return *this;

    if(c.getNbColumn()!=this->getNbColumn() || c.getNbRow()!=this->getNbRow())
    {
        this->resize(c.getNbRow(),c.getNbColumn());
        //throw "dimension matrix must agree";
    }

    for(unsigned short i=0 ; i<this->m_L ; i++)
    {
        for(unsigned short j=0 ; j<this->m_C ; j++)
        {
            this->m_A[getIndex(i,j)] = c(i,j);
        }
    }
    return *this;
}